

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O2

void __thiscall
Centaurus::Grammar<char>::print(Grammar<char> *this,wostream *os,Identifier *key,int maxdepth)

{
  wostream *pwVar1;
  ATNPrinter<char> printer;
  ATNPrinter<char> local_50;
  
  pwVar1 = std::operator<<(os,L"digraph ");
  pwVar1 = std::operator<<(pwVar1,(wstring *)&key->m_id);
  pwVar1 = std::operator<<(pwVar1,L" {");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
  pwVar1 = std::operator<<(os,L"rankdir=\"LR\";");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
  pwVar1 = std::operator<<(os,L"graph [ charset=\"UTF-8\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
  pwVar1 = std::operator<<(os,L"node [ style=\"solid,filled\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
  pwVar1 = std::operator<<(os,L"edge [ style=\"solid\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
  local_50.m_networks = &this->m_networks;
  local_50._vptr_ATNPrinter = (_func_int **)&PTR__ATNPrinter_0017d9e0;
  local_50.m_stack.super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.m_stack.super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_50.m_stack.super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_50.m_stack.super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_50._36_8_ = 0;
  local_50.m_maxdepth = maxdepth;
  ATNPrinter<char>::print(&local_50,os,key);
  pwVar1 = std::operator<<(os,L"}");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
  ATNPrinter<char>::~ATNPrinter(&local_50);
  return;
}

Assistant:

void print(std::wostream& os, const Identifier& key, int maxdepth = 3) const
	{
		os << L"digraph " << key << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

		ATNPrinter<TCHAR> printer(m_networks, maxdepth);

		printer.print(os, key);

		os << L"}" << std::endl;
	}